

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DNATypes.cpp
# Opt level: O2

bool DNA::contains(Base *dna1,size_t size1,Base *dna2,size_t size2)

{
  long lVar1;
  Base *matcher;
  Base *pBVar2;
  ulong uVar3;
  bool bVar4;
  
  if (size1 < size2) {
    return false;
  }
  lVar1 = 0;
  uVar3 = 0;
  pBVar2 = dna2;
  do {
    if (size1 * 4 == lVar1) {
      return pBVar2 == dna2 + size2;
    }
    if (uVar3 == 0) {
      uVar3 = (ulong)(*pBVar2 == *(Base *)((long)dna1 + lVar1));
      pBVar2 = pBVar2 + uVar3;
    }
    else {
      if (pBVar2 == dna2 + size2) {
        return true;
      }
      bVar4 = *pBVar2 == *(Base *)((long)dna1 + lVar1);
      uVar3 = (ulong)bVar4;
      pBVar2 = pBVar2 + 1;
      if (!bVar4) {
        pBVar2 = dna2;
      }
    }
    lVar1 = lVar1 + 4;
  } while( true );
}

Assistant:

bool DNA::contains(const DNA::Base* dna1, 
                   size_t size1, 
                   const DNA::Base* dna2, 
                   size_t size2)
{
    bool mode = false;
    const DNA::Base* end1 = dna1 + size1;
    const DNA::Base* end2 = dna2 + size2;
    const DNA::Base* matcher = dna2;
    if (size2 > size1)
        return false;
    while (dna1 != end1) {
        if (mode) {
            if (matcher == end2)
                return true;
            else if (*matcher == *dna1)
                ++matcher;
            else {
                matcher = dna2;
                mode = false;
            }
        } else {
            if (*matcher == *dna1) {
                mode = true;
                ++matcher;
            }
        }
        ++dna1;
    }
    // Check once here incase it's at the end
    if (matcher == end2)
        return true;
    return false;
}